

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O1

void __thiscall
embree::avx::
BVHNBuilderFastSpatialSAH<8,_embree::TriangleMesh,_embree::TriangleM<4>,_embree::avx::TriangleSplitterFactory>
::clear(BVHNBuilderFastSpatialSAH<8,_embree::TriangleMesh,_embree::TriangleM<4>,_embree::avx::TriangleSplitterFactory>
        *this)

{
  size_t sVar1;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar2;
  
  sVar1 = (this->prims0).size_alloced;
  ptr = (this->prims0).items;
  if (ptr != (PrimRef *)0x0) {
    if (sVar1 << 5 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar1 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar1 != 0) {
    pMVar2 = (this->prims0).alloc.device;
    (**pMVar2->_vptr_MemoryMonitorInterface)(pMVar2,sVar1 * -0x20,1);
  }
  (this->prims0).size_active = 0;
  (this->prims0).size_alloced = 0;
  (this->prims0).items = (PrimRef *)0x0;
  return;
}

Assistant:

void clear() {
        prims0.clear();
      }